

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglfunctions.h
# Opt level: O0

void __thiscall QOpenGLFunctions::glClearStencil(QOpenGLFunctions *this,GLint s)

{
  undefined4 in_ESI;
  long *in_RDI;
  
  (**(code **)(*in_RDI + 0x28))(in_ESI);
  return;
}

Assistant:

inline void QOpenGLFunctions::glClearStencil(GLint s)
{
#if QT_CONFIG(opengles2) && defined(Q_OS_ANDROID)
    ::glClearStencil(s);
#else
    Q_ASSERT(QOpenGLFunctions::isInitialized(d_ptr));
    d_ptr->f.ClearStencil(s);
#endif
    Q_OPENGL_FUNCTIONS_DEBUG
}